

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkGear.cpp
# Opt level: O3

void __thiscall chrono::ChLinkGear::ChLinkGear(ChLinkGear *this)

{
  double dVar1;
  ChQuaternion<double> local_40;
  
  ChLinkLock::ChLinkLock(&this->super_ChLinkLock);
  (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
  super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLinkGear_00b19bc0;
  this->tau = 1.0;
  this->alpha = 0.0;
  this->beta = 0.0;
  *(undefined8 *)((long)&this->beta + 2) = 0;
  *(undefined8 *)((long)&this->phase + 2) = 0;
  this->a1 = 0.0;
  this->a2 = 0.0;
  this->r1 = 0.0;
  this->r2 = 0.0;
  dVar1 = DAT_00b689a0;
  (this->contact_pt).m_data[0] = VNULL;
  (this->contact_pt).m_data[1] = dVar1;
  (this->contact_pt).m_data[2] = DAT_00b689a8;
  local_40.m_data[0] = 1.0;
  local_40.m_data[1] = 0.0;
  local_40.m_data[2] = 0.0;
  local_40.m_data[3] = 0.0;
  (this->local_shaft1)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  (this->local_shaft1).coord.pos.m_data[0] = 0.0;
  (this->local_shaft1).coord.pos.m_data[1] = 0.0;
  (this->local_shaft1).coord.pos.m_data[2] = 0.0;
  (this->local_shaft1).coord.rot.m_data[0] = 1.0;
  (this->local_shaft1).coord.rot.m_data[1] = 0.0;
  (this->local_shaft1).coord.rot.m_data[2] = 0.0;
  (this->local_shaft1).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->local_shaft1).Amatrix,&local_40);
  local_40.m_data[0] = 1.0;
  local_40.m_data[1] = 0.0;
  local_40.m_data[2] = 0.0;
  local_40.m_data[3] = 0.0;
  (this->local_shaft2)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  (this->local_shaft2).coord.pos.m_data[0] = 0.0;
  (this->local_shaft2).coord.pos.m_data[1] = 0.0;
  (this->local_shaft2).coord.pos.m_data[2] = 0.0;
  (this->local_shaft2).coord.rot.m_data[0] = 1.0;
  (this->local_shaft2).coord.rot.m_data[1] = 0.0;
  (this->local_shaft2).coord.rot.m_data[2] = 0.0;
  (this->local_shaft2).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->local_shaft2).Amatrix,&local_40);
  (this->local_shaft1).coord.pos.m_data[0] = 0.0;
  (this->local_shaft1).coord.pos.m_data[1] = 0.0;
  (this->local_shaft1).coord.pos.m_data[2] = 0.0;
  (this->local_shaft1).coord.rot.m_data[0] = 1.0;
  (this->local_shaft1).coord.rot.m_data[3] = 0.0;
  (this->local_shaft1).coord.rot.m_data[1] = 0.0;
  (this->local_shaft1).coord.rot.m_data[2] = 0.0;
  (this->local_shaft1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  *(double *)
   ((long)(this->local_shaft1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->local_shaft1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  *(double *)
   ((long)(this->local_shaft1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x18
   ) = 0.0;
  *(double *)
   ((long)(this->local_shaft1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x20
   ) = 1.0;
  *(double *)
   ((long)(this->local_shaft1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x28
   ) = 0.0;
  *(double *)
   ((long)(this->local_shaft1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x30
   ) = 0.0;
  *(double *)
   ((long)(this->local_shaft1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x38
   ) = 0.0;
  *(double *)
   ((long)(this->local_shaft1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x40
   ) = 1.0;
  (this->local_shaft2).coord.pos.m_data[2] = 0.0;
  (this->local_shaft2).coord.pos.m_data[0] = 0.0;
  (this->local_shaft2).coord.pos.m_data[1] = 0.0;
  (this->local_shaft2).coord.rot.m_data[0] = 1.0;
  (this->local_shaft2).coord.rot.m_data[3] = 0.0;
  (this->local_shaft2).coord.rot.m_data[1] = 0.0;
  (this->local_shaft2).coord.rot.m_data[2] = 0.0;
  (this->local_shaft2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  *(double *)
   ((long)(this->local_shaft2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->local_shaft2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  *(double *)
   ((long)(this->local_shaft2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x18
   ) = 0.0;
  *(double *)
   ((long)(this->local_shaft2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x20
   ) = 1.0;
  *(double *)
   ((long)(this->local_shaft2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x28
   ) = 0.0;
  *(double *)
   ((long)(this->local_shaft2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x30
   ) = 0.0;
  *(double *)
   ((long)(this->local_shaft2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x38
   ) = 0.0;
  *(double *)
   ((long)(this->local_shaft2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x40
   ) = 1.0;
  ChLinkMaskLF::SetLockMask(&(this->super_ChLinkLock).mask,true,false,false,false,false,false,false)
  ;
  ChLinkLock::BuildLink(&this->super_ChLinkLock);
  return;
}

Assistant:

ChLinkGear::ChLinkGear()
    : tau(1),
      alpha(0),
      beta(0),
      phase(0),
      checkphase(false),
      epicyclic(false),
      a1(0),
      a2(0),
      r1(0),
      r2(0),
      contact_pt(VNULL) {
    local_shaft1.SetIdentity();
    local_shaft2.SetIdentity();

    // Mask: initialize our LinkMaskLF (lock formulation mask) to X  only
    mask.SetLockMask(true, false, false, false, false, false, false);
    BuildLink();
}